

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void ui_key(int key,int down)

{
  ImGuiIO *this;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  ImGuiIO *io;
  int down_local;
  int key_local;
  
  this = ImGui::GetIO();
  if (key < 0) {
    __assert_fail("key >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/ui.cpp"
                  ,0x42,"void ui_key(int, int)");
  }
  if ((uint)key < 0x200) {
    this->KeysDown[key] = down != 0;
    local_19 = 1;
    if ((this->KeysDown[0x82] & 1U) == 0) {
      local_19 = this->KeysDown[0x87];
    }
    this->KeyCtrl = (bool)(local_19 & 1);
    local_1a = 1;
    if ((this->KeysDown[0x85] & 1U) == 0) {
      local_1a = this->KeysDown[0x8a];
    }
    this->KeyShift = (bool)(local_1a & 1);
    local_1b = 1;
    if ((this->KeysDown[0x81] & 1U) == 0) {
      local_1b = this->KeysDown[0x86];
    }
    this->KeyAlt = (bool)(local_1b & 1);
    local_1c = 1;
    if ((this->KeysDown[0x84] & 1U) == 0) {
      local_1c = this->KeysDown[0x89];
    }
    this->KeySuper = (bool)(local_1c & 1);
    if (((down != 0) && (0x1f < key)) && (key < 0x80)) {
      ImGuiIO::AddInputCharacter(this,key);
    }
    return;
  }
  __assert_fail("key < sizeof(io.KeysDown)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/ui.cpp"
                ,0x43,"void ui_key(int, int)");
}

Assistant:

void ui_key(int key /*AKey*/, int down) {
	ImGuiIO& io = ImGui::GetIO();
	IM_ASSERT(key >= 0);
	IM_ASSERT(key < sizeof(io.KeysDown));
	io.KeysDown[key] = !!down;

	io.KeyCtrl = io.KeysDown[AK_LeftCtrl] || io.KeysDown[AK_RightCtrl];
	io.KeyShift = io.KeysDown[AK_LeftShift] || io.KeysDown[AK_RightShift];
	io.KeyAlt = io.KeysDown[AK_LeftAlt] || io.KeysDown[AK_RightAlt];
	io.KeySuper = io.KeysDown[AK_LeftSuper] || io.KeysDown[AK_RightSuper];

	if (down && key >= 32 && key < 128)
		io.AddInputCharacter(key);
}